

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_slay(parser *p)

{
  byte bVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  void *pvVar5;
  ulong uVar6;
  slay_conflict *psVar7;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getstr(p,"code");
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->slay_max;
    uVar6 = 1;
    if (1 < bVar1) {
      uVar6 = 1;
      psVar7 = slays;
      do {
        psVar7 = psVar7 + 1;
        iVar2 = strcmp(__s1,psVar7->code);
        if (iVar2 == 0) goto LAB_001a065e;
        uVar6 = uVar6 + 1;
      } while ((uint)bVar1 != uVar6);
      uVar6 = (ulong)(uint)bVar1;
    }
LAB_001a065e:
    pVar3 = PARSE_ERROR_UNRECOGNISED_SLAY;
    if ((uint)uVar6 != (uint)bVar1) {
      if (*(long *)((long)pvVar4 + 0xe0) == 0) {
        pvVar5 = mem_zalloc((ulong)bVar1);
        *(void **)((long)pvVar4 + 0xe0) = pvVar5;
      }
      *(undefined1 *)(*(long *)((long)pvVar4 + 0xe0) + (uVar6 & 0xffffffff)) = 1;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_artifact_slay(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->slay_max; i++) {
		if (streq(s, slays[i].code)) break;
	}
	if (i == z_info->slay_max) {
		return PARSE_ERROR_UNRECOGNISED_SLAY;
	}
	if (!a->slays) {
		a->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	}
	a->slays[i] = true;
	return PARSE_ERROR_NONE;
}